

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fStencilTexturingTests.cpp
# Opt level: O3

void deqp::gles31::Functional::anon_unknown_1::checkFramebufferStatus(Functions *gl)

{
  NotSupportedError *this;
  TestError *this_00;
  string local_70;
  string local_50;
  code *local_30;
  int local_28;
  
  local_28 = (*(code *)gl)(0x8d40);
  if (local_28 == 0x8cd5) {
    return;
  }
  if (local_28 == 0x8cdd) {
    this = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"Unsupported framebuffer configuration","");
    tcu::NotSupportedError::NotSupportedError(this,&local_70);
    __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  local_30 = glu::getFramebufferStatusName;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_50,&local_30);
  std::operator+(&local_70,"Incomplete framebuffer: ",&local_50);
  tcu::TestError::TestError(this_00,&local_70);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

static void checkFramebufferStatus (const glw::Functions& gl)
{
	const deUint32 status = gl.checkFramebufferStatus(GL_FRAMEBUFFER);

	if (status == GL_FRAMEBUFFER_UNSUPPORTED)
		throw tcu::NotSupportedError("Unsupported framebuffer configuration");
	else if (status != GL_FRAMEBUFFER_COMPLETE)
		throw tcu::TestError("Incomplete framebuffer: " + glu::getFramebufferStatusStr(status).toString());
}